

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.h
# Opt level: O0

bool GEO::String::string_to_signed_integer<int>(char *s,int *value)

{
  int iVar1;
  int *piVar2;
  longlong lVar3;
  int64 v;
  char *end;
  int *value_local;
  char *s_local;
  
  end = (char *)value;
  value_local = (int *)s;
  piVar2 = __errno_location();
  *piVar2 = 0;
  lVar3 = strtoll((char *)value_local,(char **)&v,10);
  if (((((int *)v != value_local) && (*(char *)v == '\0')) &&
      (piVar2 = __errno_location(), *piVar2 == 0)) &&
     ((iVar1 = std::numeric_limits<int>::min(), iVar1 <= lVar3 &&
      (iVar1 = std::numeric_limits<int>::max(), lVar3 <= iVar1)))) {
    *(int *)end = (int)lVar3;
    return true;
  }
  return false;
}

Assistant:

inline bool string_to_signed_integer(const char* s, T& value) {
            errno = 0;
            char* end;
#ifdef GEO_OS_WINDOWS
            Numeric::int64 v = _strtoi64(s, &end, 10);
#else
            Numeric::int64 v = strtoll(s, &end, 10);
#endif
            if(
                end != s && *end == '\0' && errno == 0 &&
                v >= std::numeric_limits<T>::min() &&
                v <= std::numeric_limits<T>::max()
            ) {
                value = static_cast<T>(v);
                return true;
            }

            return false;
        }